

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.hpp
# Opt level: O3

string * __thiscall
pstore::indirect_string::to_string_abi_cxx11_(string *__return_storage_ptr__,indirect_string *this)

{
  raw_sstring_view rVar1;
  shared_sstring_view owner;
  sstring_view<std::shared_ptr<const_char>_> local_38;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_20;
  
  local_20.ptr_ = &local_38;
  local_38.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.size_ = 0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_20);
  rVar1 = as_string_view(this,local_20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,rVar1.ptr_,rVar1.ptr_ + rVar1.size_);
  if (local_38.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string () const {
            shared_sstring_view owner;
            return this->as_string_view (&owner).to_string ();
        }